

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  sat_solver2 *psVar3;
  byte *pbVar4;
  uint *puVar5;
  void *pvVar6;
  Gia_Obj_t *pGVar7;
  void *pvVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Gia_Man_t *p;
  Abc_Cex_t *pAVar14;
  Abs_Par_t *pAVar15;
  Gia_Man_t *pGVar16;
  Vec_Wrd_t *p_00;
  word *pwVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  void *pvVar20;
  Abc_Frame_t *pAbc;
  Vec_Int_t *pVVar21;
  Vec_Int_t *pVVar22;
  int *piVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  Abs_Par_t *pAVar28;
  long lVar29;
  Gia_Man_t *pGVar30;
  Gla_Man_t *p_01;
  Gia_Man_t *__ptr;
  Gia_Man_t *p_02;
  char *pcVar31;
  ulong uVar32;
  Gia_Man_t *pGVar33;
  int iVar34;
  int iVar35;
  double dVar36;
  int Status;
  int nConfls;
  timespec ts;
  uint local_474;
  int local_464;
  Vec_Int_t *local_460;
  long local_458;
  Abs_Par_t *local_450;
  ulong local_448;
  int local_43c;
  uint local_438;
  int local_434;
  undefined4 local_430;
  int local_42c;
  Gia_Man_t *local_428;
  uint local_420;
  int local_41c;
  Gia_Man_t local_418;
  
  local_450 = pPars;
  iVar10 = clock_gettime(3,(timespec *)&local_418);
  pAVar28 = local_450;
  if (iVar10 < 0) {
    local_458 = -1;
  }
  else {
    local_458 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  iVar10 = pAig->nRegs;
  pVVar21 = pAig->vCos;
  iVar34 = pVVar21->nSize;
  if (iVar34 - iVar10 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  iVar11 = local_450->nFramesMax;
  if ((iVar11 != 0) && (iVar11 < local_450->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (iVar34 <= iVar10) {
LAB_0056de11:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar34 < 1) {
LAB_0056de30:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar34 = *pVVar21->pArray;
  if ((long)iVar34 < 0) {
LAB_0056dd76:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar24 = pAig->nObjs;
  if ((int)uVar24 <= iVar34) goto LAB_0056dd76;
  pGVar2 = pAig->pObjs;
  pGVar7 = pGVar2 + iVar34;
  uVar12 = (uint)*(undefined8 *)pGVar7;
  if ((~*(ulong *)(pGVar7 + -(ulong)(uVar12 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    if ((uVar12 >> 0x1d & 1) != 0) {
      if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
        free(pAig->pCexSeq);
        pAig->pCexSeq = (Abc_Cex_t *)0x0;
        iVar10 = pAig->nRegs;
      }
      pAVar14 = Abc_CexMakeTriv(iVar10,pAig->vCis->nSize - iVar10,1,0);
      pAig->pCexSeq = pAVar14;
      puts("Sequential miter is trivially SAT.");
      return 0;
    }
    puts("Sequential miter is trivially UNSAT.");
    return 1;
  }
  iVar34 = -1;
  lVar26 = local_458;
  if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
    if (fStartVta == 0) {
      pVVar22 = (Vec_Int_t *)malloc(0x10);
      uVar32 = 0x10;
      if (0xe < uVar24 - 1) {
        uVar32 = (ulong)uVar24;
      }
      pVVar22->nCap = (int)uVar32;
      piVar23 = (int *)malloc(uVar32 << 2);
      pVVar22->pArray = piVar23;
      pVVar22->nSize = uVar24;
      memset(piVar23,0,(ulong)uVar24 * 4);
      pAig->vGateClasses = pVVar22;
      *piVar23 = 1;
      if (pVVar21->nSize <= iVar10) goto LAB_0056de11;
      if (pVVar21->nSize < 1) goto LAB_0056de30;
      uVar12 = *pVVar21->pArray;
      if (((long)(int)uVar12 < 0) || (uVar24 <= uVar12)) goto LAB_0056dd76;
      uVar12 = uVar12 - (*(uint *)(pGVar2 + (int)uVar12) & 0x1fffffff);
      if (((int)uVar12 < 0) || (uVar24 <= uVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar23[uVar12] = 1;
      iVar34 = -1;
      pAVar28 = local_450;
      lVar26 = local_458;
    }
    else {
      iVar10 = local_450->nFramesStart;
      iVar35 = local_450->nTimeOut;
      iVar1 = local_450->fDumpVabs;
      local_450->nFramesMax = iVar10;
      iVar34 = 2;
      if (iVar10 / 2 < 2) {
        iVar34 = iVar10 / 2;
      }
      local_450->nFramesStart = iVar34 + 1;
      local_450->nTimeOut = 0x14;
      local_450->fDumpVabs = 0;
      iVar34 = Gia_VtaPerformInt(pAig,local_450);
      pAVar28->nFramesMax = iVar11;
      pAVar28->nFramesStart = iVar10;
      pAVar28->nTimeOut = iVar35;
      pAVar28->fDumpVabs = iVar1;
      pVVar21 = pAig->vGateClasses;
      if (pVVar21 != (Vec_Int_t *)0x0) {
        if (pVVar21->pArray != (int *)0x0) {
          free(pVVar21->pArray);
          pAig->vGateClasses->pArray = (int *)0x0;
          pVVar21 = pAig->vGateClasses;
          if (pVVar21 == (Vec_Int_t *)0x0) goto LAB_0056c471;
        }
        free(pVVar21);
        pAig->vGateClasses = (Vec_Int_t *)0x0;
      }
LAB_0056c471:
      lVar26 = local_458;
      if (pAig->vObjClasses != (Vec_Int_t *)0x0) {
        pVVar21 = Gia_VtaConvertToGla(pAig,pAig->vObjClasses);
        pAig->vGateClasses = pVVar21;
        pVVar21 = pAig->vObjClasses;
        if (pVVar21 != (Vec_Int_t *)0x0) {
          if (pVVar21->pArray != (int *)0x0) {
            free(pVVar21->pArray);
            pAig->vObjClasses->pArray = (int *)0x0;
            pVVar21 = pAig->vObjClasses;
            if (pVVar21 == (Vec_Int_t *)0x0) goto LAB_0056c4e8;
          }
          free(pVVar21);
          pAig->vObjClasses = (Vec_Int_t *)0x0;
        }
      }
LAB_0056c4e8:
      if (iVar34 == 0) {
        return 0;
      }
      if (pAig->vGateClasses == (Vec_Int_t *)0x0) {
        return iVar34;
      }
    }
  }
  pGVar33 = pAig;
  local_434 = iVar34;
  p = (Gia_Man_t *)Gla_ManStart(pAig,pAVar28);
  iVar34 = 3;
  iVar10 = clock_gettime(3,(timespec *)&local_418);
  if (iVar10 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  p->pIso = (int *)(lVar25 - lVar26);
  pAVar15 = *(Abs_Par_t **)&p->nRegs;
  iVar10 = pAVar15->nTimeOut;
  if ((long)iVar10 != 0) {
    psVar3 = *(sat_solver2 **)&p->nHTable;
    iVar34 = 3;
    iVar11 = clock_gettime(3,(timespec *)&local_418);
    if (iVar11 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    psVar3->nRuntimeLimit = lVar25 + (long)iVar10 * 1000000;
    pAVar15 = *(Abs_Par_t **)&p->nRegs;
    pAVar28 = local_450;
  }
  if (pAVar15->fVerbose != 0) {
    Abc_Print(iVar34,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(iVar34,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pAVar28->nFramesMax,(ulong)(uint)pAVar28->nConfLimit,
              (ulong)(uint)pAVar28->nTimeOut,(ulong)(uint)pAVar28->nRatioMin);
    pGVar33 = (Gia_Man_t *)(ulong)(uint)pAVar28->nLearnedPerce;
    Abc_Print(iVar34,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pAVar28->nLearnedStart,(ulong)(uint)pAVar28->nLearnedDelta);
    Abc_Print(iVar34,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
    pAVar15 = *(Abs_Par_t **)&p->nRegs;
  }
  if (-1 < pAVar15->nFramesMax) {
    uVar32 = 0;
    local_438 = 0;
    local_43c = 0;
    local_430 = 0;
    local_458 = lVar26;
    local_428 = p;
LAB_0056c61e:
    local_42c = *(int *)(*(long *)&p->nHTable + 0x230);
    iVar10 = (int)uVar32;
    pAVar15->iFrame = iVar10;
    Gia_GlaAddTimeFrame((Gla_Man_t *)p,iVar10);
    uVar12 = iVar10 + 1;
    uVar24 = 0;
    local_448 = uVar32;
    do {
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar26 = 1;
      }
      else {
        lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418.pSpec),8);
        lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + (long)local_418.pName * -1000000;
      }
      pGVar16 = (Gia_Man_t *)
                Gla_ManUnsatCore((Gla_Man_t *)p,(int)uVar32,*(sat_solver2 **)&p->nHTable,
                                 pAVar28->nConfLimit,(int)pGVar33,&local_464,&local_41c);
      lVar25 = *(long *)&p->nHTable;
      if (local_464 == -1) {
LAB_0056d110:
        uVar32 = local_448;
        pvVar20 = *(void **)(lVar25 + 0x1e8);
        if (pvVar20 != (void *)0x0) {
          pvVar8 = *(void **)((long)pvVar20 + 0x20);
          pvVar6 = *(void **)((long)pvVar8 + 8);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
          free(pvVar8);
          pvVar8 = *(void **)((long)pvVar20 + 0x18);
          pvVar6 = *(void **)((long)pvVar8 + 8);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
          free(pvVar8);
          free(pvVar20);
        }
        *(undefined8 *)(lVar25 + 0x1e8) = 0;
        lVar26 = local_458;
        local_474 = (uint)uVar32;
        goto LAB_0056d181;
      }
      if (*(long *)(lVar25 + 0x260) != 0) {
        iVar10 = clock_gettime(3,(timespec *)&local_418);
        if (iVar10 < 0) {
          lVar27 = -1;
        }
        else {
          lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        lVar25 = *(long *)&p->nHTable;
        if (*(long *)(lVar25 + 0x260) < lVar27) goto LAB_0056d110;
      }
      if (local_464 == 1) {
        pvVar20 = *(void **)(lVar25 + 0x1e8);
        if (pvVar20 != (void *)0x0) {
          pvVar8 = *(void **)((long)pvVar20 + 0x20);
          pvVar6 = *(void **)((long)pvVar8 + 8);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
          free(pvVar8);
          pvVar8 = *(void **)((long)pvVar20 + 0x18);
          pvVar6 = *(void **)((long)pvVar8 + 8);
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
          free(pvVar8);
          free(pvVar20);
          p = local_428;
        }
        *(undefined8 *)(lVar25 + 0x1e8) = 0;
        p_02 = (Gia_Man_t *)0x3;
        pGVar30 = &local_418;
        iVar10 = clock_gettime(3,(timespec *)pGVar30);
        if (iVar10 < 0) {
          lVar25 = -1;
        }
        else {
          lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        p->pFanData = (int *)((long)p->pFanData + lVar25 + lVar26);
        goto LAB_0056cd99;
      }
      p_01 = (Gla_Man_t *)0x3;
      pGVar30 = &local_418;
      iVar10 = clock_gettime(3,(timespec *)pGVar30);
      iVar34 = (int)pGVar30;
      if (iVar10 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      *(long *)&p->nTerLoop = *(long *)&p->nTerLoop + lVar25 + lVar26;
      if (local_464 != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      *(int *)&p->vCis = *(int *)&p->vCis + 1;
      iVar10 = Abc_FrameIsBridgeMode();
      if ((iVar10 != 0) && (local_43c != 0)) {
        Gia_GlaSendCancel(p_01,iVar34);
        local_43c = 0;
      }
      pGVar30 = &local_418;
      clock_gettime(3,(timespec *)pGVar30);
      if (pAVar28->fAddLayer == 0) {
        p_02 = p;
        local_460 = Gla_ManRefinement((Gla_Man_t *)p);
        if (local_460 == (Vec_Int_t *)0x0) goto LAB_0056cd1f;
      }
      else {
        local_460 = Gla_ManCollectPPis((Gla_Man_t *)p,(Vec_Int_t *)pGVar30);
      }
      uVar32 = local_448;
      pVVar21 = local_460;
      piVar23 = *(int **)&p->nHTable;
      if (uVar24 == 0) {
        if (piVar23[2] != piVar23[3]) {
          __assert_fail("s->qhead == s->qtail",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                        ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
        }
        piVar23[0x36] = *piVar23;
        piVar23[0x37] = piVar23[2];
        pbVar4 = *(byte **)(piVar23 + 0x72);
        if (pbVar4 != (byte *)0x0) {
          piVar23[0x38] =
               (*(int *)(pbVar4 + 0xc) << (*pbVar4 & 0x1f)) +
               **(int **)(*(long *)(pbVar4 + 0x18) + (long)*(int *)(pbVar4 + 0xc) * 8);
        }
        *(undefined8 *)(piVar23 + 0x22) = *(undefined8 *)(piVar23 + 0x1e);
        pGVar33 = *(Gia_Man_t **)(piVar23 + 0x2a);
        piVar23[0x20] =
             piVar23[0x24] << ((byte)piVar23[0x26] & 0x1f) |
             *(uint *)(&pGVar33->pName)[piVar23[0x24]];
        piVar23[0x21] =
             piVar23[0x25] << ((byte)piVar23[0x26] & 0x1f) |
             *(uint *)(&pGVar33->pName)[piVar23[0x25]];
        if (*(void **)(piVar23 + 0x10) != (void *)0x0) {
          piVar23[0xc] = piVar23[0xb];
          memcpy(*(void **)(piVar23 + 0x10),*(void **)(piVar23 + 0xe),(long)*piVar23 << 2);
          piVar23 = *(int **)&p->nHTable;
        }
        p->pRefs[1] = 0;
        *(undefined4 *)&p->field_0x3c = *(undefined4 *)(*(long *)&p->nObjs + 4);
        if (*(long *)(piVar23 + 0x7a) != 0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        local_430 = *(undefined4 *)&p->vCos;
        if (*(long *)(piVar23 + 0x72) == 0) {
          puVar18 = (undefined8 *)calloc(1,0x30);
          *puVar18 = 0xffffffffffffffff;
          puVar19 = (undefined8 *)malloc(0x10);
          *puVar19 = 1000;
          pvVar20 = malloc(8000);
          puVar19[1] = pvVar20;
          puVar18[3] = puVar19;
          puVar19 = (undefined8 *)malloc(0x10);
          *puVar19 = 1000;
          pvVar20 = malloc(4000);
          puVar19[1] = pvVar20;
          puVar18[4] = puVar19;
          *(undefined8 **)(piVar23 + 0x7a) = puVar18;
          *(undefined4 *)&p->pReprsOld = 0;
          puVar5 = *(uint **)&p->nTravIds;
          uVar13 = *(uint *)(p->pSpec + 0x18);
          if ((int)*puVar5 < (int)uVar13) {
            if (*(void **)(puVar5 + 2) == (void *)0x0) {
              pvVar20 = malloc((long)(int)uVar13 << 2);
            }
            else {
              pvVar20 = realloc(*(void **)(puVar5 + 2),(long)(int)uVar13 << 2);
            }
            *(void **)(puVar5 + 2) = pvVar20;
            if (pvVar20 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *puVar5 = uVar13;
          }
          pVVar21 = local_460;
          if (0 < (int)uVar13) {
            memset(*(void **)(puVar5 + 2),0xff,(ulong)uVar13 * 4);
          }
          puVar5[1] = uVar13;
          piVar23 = *(int **)(*(long *)&p->nHTable + 0x1e8);
          if (*piVar23 != -1) {
            __assert_fail("p->iFirst == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                          ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
          }
          uVar13 = pVVar21->nSize;
          iVar10 = p->nTravIds;
          iVar34 = p->nFront;
          *piVar23 = *(int *)(*(long *)&p->nHTable + 0x210);
          piVar23[2] = (((int)uVar13 >> 6) + 1) - (uint)((uVar13 & 0x3f) == 0);
          piVar23[10] = iVar10;
          piVar23[0xb] = iVar34;
          piVar23[4] = 0;
          piVar23[5] = 0;
          *(undefined4 *)(*(long *)(piVar23 + 6) + 4) = 0;
          uVar32 = local_448;
        }
      }
      else {
        piVar23 = *(int **)(piVar23 + 0x7a);
        if (piVar23 != (int *)0x0) {
          if (*piVar23 < 0) {
            __assert_fail("p->iFirst >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                          ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          if (*(long *)(piVar23 + 4) != 0) {
            __assert_fail("p->pInfo == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satProof2.h"
                          ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          uVar13 = local_460->nSize + *(int *)&p->pReprsOld;
          iVar10 = piVar23[2];
          if (iVar10 * 0x40 <= (int)uVar13) {
            iVar34 = (((int)uVar13 >> 6) + 1) - (uint)((uVar13 & 0x3f) == 0);
            iVar11 = iVar10 * 2;
            if (iVar34 == iVar11 || SBORROW4(iVar34,iVar11) != iVar34 + iVar10 * -2 < 0) {
              iVar34 = iVar11;
            }
            pvVar20 = *(void **)(piVar23 + 6);
            iVar10 = *(int *)((long)pvVar20 + 4) / iVar10;
            iVar11 = (iVar10 + 1000) * iVar34;
            local_420 = uVar24;
            p_00 = (Vec_Wrd_t *)malloc(0x10);
            if (iVar11 - 1U < 0xf) {
              iVar11 = 0x10;
            }
            p_00->nSize = 0;
            p_00->nCap = iVar11;
            if (iVar11 == 0) {
              pwVar17 = (word *)0x0;
            }
            else {
              pwVar17 = (word *)malloc((long)iVar11 << 3);
            }
            p_00->pArray = pwVar17;
            if (0 < iVar10) {
              iVar11 = 0;
              do {
                uVar24 = piVar23[2] * iVar11;
                if (((int)uVar24 < 0) || (*(int *)(*(long *)(piVar23 + 6) + 4) <= (int)uVar24)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                                ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                *(ulong *)(piVar23 + 4) = *(long *)(*(long *)(piVar23 + 6) + 8) + (ulong)uVar24 * 8;
                lVar26 = 0;
                if (0 < piVar23[2]) {
                  do {
                    Vec_WrdPush(p_00,*(word *)(*(long *)(piVar23 + 4) + lVar26 * 8));
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < piVar23[2]);
                }
                iVar35 = iVar34 - (int)lVar26;
                if (iVar35 != 0 && (int)lVar26 <= iVar34) {
                  do {
                    Vec_WrdPush(p_00,0);
                    iVar35 = iVar35 + -1;
                  } while (iVar35 != 0);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 != iVar10);
              pvVar20 = *(void **)(piVar23 + 6);
            }
            if (*(void **)((long)pvVar20 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar20 + 8));
            }
            free(pvVar20);
            *(Vec_Wrd_t **)(piVar23 + 6) = p_00;
            piVar23[2] = iVar34;
            piVar23[4] = 0;
            piVar23[5] = 0;
            p = local_428;
            pVVar21 = local_460;
            uVar32 = local_448;
            uVar24 = local_420;
          }
        }
      }
      pAVar28 = local_450;
      pGVar16 = (Gia_Man_t *)(ulong)uVar24;
      Gia_GlaAddToAbs((Gla_Man_t *)p,pVVar21,1);
      Gia_GlaAddOneSlice((Gla_Man_t *)p,(int)uVar32,pVVar21);
      if (pVVar21->pArray != (int *)0x0) {
        free(pVVar21->pArray);
      }
      free(pVVar21);
      if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
        iVar10 = *(int *)(*(long *)&p->nHTable + 0x230);
        iVar34 = clock_gettime(3,(timespec *)&local_418);
        p = local_428;
        if (iVar34 < 0) {
          lVar26 = -1;
        }
        else {
          lVar26 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
        }
        Gla_ManAbsPrintFrame
                  ((Gla_Man_t *)local_428,-1,uVar12,iVar10 - local_42c,uVar24,lVar26 - local_458);
        pGVar33 = pGVar16;
      }
      uVar24 = uVar24 + 1;
    } while( true );
  }
  local_474 = 0;
LAB_0056d181:
  if ((*(int *)(*(long *)&p->nRegs + 0x70) != 0) && (local_464 == -1)) {
    putchar(10);
  }
  pVVar21 = pAig->vGateClasses;
  if (pVVar21 != (Vec_Int_t *)0x0) {
    if (pVVar21->pArray != (int *)0x0) {
      free(pVVar21->pArray);
      pAig->vGateClasses->pArray = (int *)0x0;
      pVVar21 = pAig->vGateClasses;
      if (pVVar21 == (Vec_Int_t *)0x0) goto LAB_0056d1ec;
    }
    free(pVVar21);
    pAig->vGateClasses = (Vec_Int_t *)0x0;
  }
LAB_0056d1ec:
  pGVar33 = p;
  pVVar21 = Gla_ManTranslate((Gla_Man_t *)p);
  pAVar28 = local_450;
  iVar10 = (int)pGVar33;
  pAig->vGateClasses = pVVar21;
  lVar25 = *(long *)&p->nRegs;
  if (local_464 == -1) {
    if (*(int *)(lVar25 + 0x20) == 0) {
LAB_0056d352:
      uVar24 = pAVar28->nConfLimit;
      if ((uVar24 == 0) || (*(int *)(*(long *)&p->nHTable + 0x230) < (int)uVar24)) {
        pGVar33 = p;
        iVar34 = Gia_GlaAbsCount((Gla_Man_t *)p,0,0);
        iVar10 = (int)pGVar33;
        uVar24 = pAVar28->nRatioMin;
        if (iVar34 < (int)((100 - uVar24) * (p->nBufs + -1)) / 100) {
          Abc_Print(iVar10,"Abstraction stopped for unknown reason in frame %d.  ",(ulong)local_474)
          ;
          goto LAB_0056d3f6;
        }
        pcVar31 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar12 = local_474;
        goto LAB_0056d21a;
      }
      uVar12 = *(uint *)(*(long *)&p->nRegs + 0x80);
      pcVar31 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      iVar10 = 3;
      iVar34 = clock_gettime(3,(timespec *)&local_418);
      if (iVar34 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      if (lVar25 < *(long *)(*(long *)&p->nHTable + 0x260)) goto LAB_0056d352;
      uVar24 = *(uint *)(*(long *)&p->nRegs + 0x20);
      uVar12 = *(uint *)(*(long *)&p->nRegs + 0x80);
      pcVar31 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar10,pcVar31,(ulong)uVar24,(ulong)local_474,(ulong)uVar12);
  }
  else {
    *(int *)(lVar25 + 0x78) = *(int *)(lVar25 + 0x78) + 1;
    pcVar31 = "GLA completed %d frames with a %d-stable abstraction.  ";
    uVar12 = *(uint *)(lVar25 + 0x80);
    uVar24 = local_474;
LAB_0056d21a:
    Abc_Print(iVar10,pcVar31,(ulong)uVar24,(ulong)uVar12);
  }
LAB_0056d3f6:
  iVar34 = 3;
  iVar10 = clock_gettime(3,(timespec *)&local_418);
  if (iVar10 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
  }
  Abc_Print(iVar34,"%s =","Time");
  Abc_Print(iVar34,"%9.2f sec\n",(double)(lVar25 - lVar26) / 1000000.0);
  if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    lVar27 = -1;
    lVar25 = -1;
    if (-1 < iVar10) {
      lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    p->vFanoutNums =
         (Vec_Int_t *)
         (lVar25 - (*(long *)&p->nFansAlloc + *(long *)&p->nTerLoop +
                    (long)p->pFanData + (long)p->pIso + lVar26));
    Abc_Print(iVar34,"%s =","Runtime: Initializing");
    piVar23 = p->pIso;
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (-1 < iVar10) {
      lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar27 != lVar26) {
      local_460 = (Vec_Int_t *)((double)(long)p->pIso * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar25 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar23 / 1000000.0,dVar36);
    Abc_Print(iVar34,"%s =","Runtime: Solver UNSAT");
    piVar23 = p->pFanData;
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (iVar10 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar25 != lVar26) {
      local_460 = (Vec_Int_t *)((double)(long)p->pFanData * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar25 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)(long)piVar23 / 1000000.0,dVar36);
    Abc_Print(iVar34,"%s =","Runtime: Solver SAT  ");
    lVar25._0_4_ = p->nTerLoop;
    lVar25._4_4_ = p->nTerStates;
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (iVar10 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar27 != lVar26) {
      lVar27._0_4_ = p->nTerLoop;
      lVar27._4_4_ = p->nTerStates;
      local_460 = (Vec_Int_t *)((double)lVar27 * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar27 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar36);
    Abc_Print(iVar34,"%s =","Runtime: Refinement  ");
    lVar25 = *(long *)&p->nFansAlloc;
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (iVar10 < 0) {
      lVar27 = -1;
    }
    else {
      lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar27 != lVar26) {
      local_460 = (Vec_Int_t *)((double)*(long *)&p->nFansAlloc * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar27 = -1;
      }
      else {
        lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar27 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar36);
    Abc_Print(iVar34,"%s =","Runtime: Other       ");
    pVVar21 = p->vFanoutNums;
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (iVar10 < 0) {
      lVar25 = -1;
    }
    else {
      lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar25 != lVar26) {
      local_460 = (Vec_Int_t *)((double)(long)p->vFanoutNums * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (iVar10 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar25 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)(long)pVVar21 / 1000000.0,dVar36);
    Abc_Print(iVar34,"%s =","Runtime: TOTAL       ");
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    lVar27 = -1;
    lVar25 = -1;
    if (-1 < iVar10) {
      lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    iVar34 = 3;
    iVar10 = clock_gettime(3,(timespec *)&local_418);
    if (-1 < iVar10) {
      lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    dVar36 = 0.0;
    if (lVar27 != lVar26) {
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      lVar29 = -1;
      lVar27 = -1;
      if (-1 < iVar10) {
        lVar27 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      local_460 = (Vec_Int_t *)((double)(lVar27 - lVar26) * 100.0);
      iVar34 = 3;
      iVar10 = clock_gettime(3,(timespec *)&local_418);
      if (-1 < iVar10) {
        lVar29 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      dVar36 = (double)local_460 / (double)(lVar29 - lVar26);
    }
    Abc_Print(iVar34,"%9.2f sec (%6.2f %%)\n",(double)(lVar25 - lVar26) / 1000000.0,dVar36);
    Gla_ManReportMemory((Gla_Man_t *)p);
  }
  Gla_ManStop((Gla_Man_t *)p);
  fflush(_stdout);
LAB_0056cd1f:
  lVar26 = *(long *)&p->nHTable;
  __ptr = *(Gia_Man_t **)(lVar26 + 0x1e8);
  if (__ptr != (Gia_Man_t *)0x0) {
    pGVar7 = __ptr->pObjs;
    pvVar20 = *(void **)&pGVar7->Value;
    if (pvVar20 != (void *)0x0) {
      free(pvVar20);
    }
    free(pGVar7);
    pvVar20 = *(void **)&__ptr->nObjs;
    pvVar8 = *(void **)((long)pvVar20 + 8);
    if (pvVar8 != (void *)0x0) {
      free(pvVar8);
    }
    free(pvVar20);
    free(__ptr);
    p_02 = __ptr;
  }
  *(undefined8 *)(lVar26 + 0x1e8) = 0;
  pcVar31 = p->pSpec;
  pAVar14 = *(Abc_Cex_t **)(pcVar31 + 0x110);
  pcVar31[0x110] = '\0';
  pcVar31[0x111] = '\0';
  pcVar31[0x112] = '\0';
  pcVar31[0x113] = '\0';
  pcVar31[0x114] = '\0';
  pcVar31[0x115] = '\0';
  pcVar31[0x116] = '\0';
  pcVar31[0x117] = '\0';
  pAVar28 = local_450;
  if (pAVar14 != (Abc_Cex_t *)0x0) {
    if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
      putchar(10);
    }
    uVar32 = local_448;
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
    }
    pAig->pCexSeq = pAVar14;
    local_434 = 0;
    pGVar33 = pAig;
    iVar10 = Gia_ManVerifyCex(pAig,pAVar14,0);
    iVar34 = (int)pGVar33;
    if (iVar10 == 0) {
      Abc_Print(iVar34,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar34,"Counter-example detected in frame %d.  ",uVar32 & 0xffffffff);
    lVar26 = local_458;
    *(int *)(*(long *)&p->nRegs + 0x78) = pAVar14->iFrame + -1;
    pVVar21 = pAig->vGateClasses;
    if (pVVar21 == (Vec_Int_t *)0x0) goto LAB_0056d3f6;
    if (pVVar21->pArray != (int *)0x0) {
      free(pVVar21->pArray);
      pAig->vGateClasses->pArray = (int *)0x0;
      pVVar21 = pAig->vGateClasses;
      if (pVVar21 == (Vec_Int_t *)0x0) goto LAB_0056d3f6;
    }
    free(pVVar21);
    pAig->vGateClasses = (Vec_Int_t *)0x0;
    goto LAB_0056d3f6;
  }
LAB_0056cd99:
  if (local_464 != 1) {
    __assert_fail("Status == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (pGVar16 == (Gia_Man_t *)0x0) {
    iVar10 = 1;
    if (uVar24 != 0) goto LAB_0056cdf4;
    lVar26 = *(long *)&p->nRegs + 0x80;
    *(int *)lVar26 = *(int *)lVar26 + 1;
  }
  else {
    iVar10 = *(int *)((long)&pGVar16->pName + 4) + 1;
    pGVar30 = pGVar16;
    Gia_GlaAddToCounters((Gla_Man_t *)p,(Vec_Int_t *)pGVar16);
    if (uVar24 != 0) {
LAB_0056cdf4:
      *(undefined4 *)(*(long *)&p->nRegs + 0x80) = 0;
      sat_solver2_rollback(*(sat_solver2 **)&p->nHTable);
      Gla_ManRollBack((Gla_Man_t *)p);
      *(undefined4 *)&p->vCos = local_430;
      Gia_GlaAddToAbs((Gla_Man_t *)p,(Vec_Int_t *)pGVar16,0);
      Gia_GlaAddOneSlice((Gla_Man_t *)p,(int)local_448,(Vec_Int_t *)pGVar16);
      if ((int *)pGVar16->pSpec != (int *)0x0) {
        free(pGVar16->pSpec);
      }
      free(pGVar16);
      iVar34 = clock_gettime(3,(timespec *)&local_418);
      if (iVar34 < 0) {
        lVar26 = 1;
      }
      else {
        lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418.pSpec),8);
        lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + (long)local_418.pName * -1000000;
      }
      pGVar16 = (Gia_Man_t *)
                Gla_ManUnsatCore((Gla_Man_t *)p,(int)local_448,*(sat_solver2 **)&p->nHTable,
                                 pAVar28->nConfLimit,(int)pGVar33,&local_464,&local_41c);
      p_02 = (Gia_Man_t *)0x3;
      iVar34 = clock_gettime(3,(timespec *)&local_418);
      if (iVar34 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
      }
      p->pFanData = (int *)((long)p->pFanData + lVar25 + lVar26);
      if (pGVar16 != (Gia_Man_t *)0x0) {
        if ((int *)pGVar16->pSpec != (int *)0x0) {
          free(pGVar16->pSpec);
        }
        free(pGVar16);
        p_02 = pGVar16;
      }
      local_474 = (uint)local_448;
      lVar26 = local_458;
      if (local_464 == -1) goto LAB_0056d181;
      if (local_464 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      bVar9 = 0;
      pGVar30 = pAig;
      goto LAB_0056cf5c;
    }
    lVar26 = *(long *)&p->nRegs + 0x80;
    *(int *)lVar26 = *(int *)lVar26 + 1;
    if ((int *)pGVar16->pSpec != (int *)0x0) {
      free(pGVar16->pSpec);
    }
    free(pGVar16);
    p_02 = pGVar16;
  }
  bVar9 = 1;
  local_474 = (uint)local_448;
LAB_0056cf5c:
  iVar34 = (int)pGVar30;
  if (*(int *)(*(long *)&p->nRegs + 0x70) != 0) {
    iVar11 = *(int *)(*(long *)&p->nHTable + 0x230);
    iVar34 = clock_gettime(3,(timespec *)&local_418);
    p = local_428;
    if (iVar34 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418.pSpec / 1000 + (long)local_418.pName * 1000000;
    }
    pGVar33 = (Gia_Man_t *)(ulong)uVar24;
    p_02 = local_428;
    iVar34 = iVar10;
    Gla_ManAbsPrintFrame
              ((Gla_Man_t *)local_428,iVar10,uVar12,iVar11 - local_42c,uVar24,lVar26 - local_458);
  }
  pAVar28 = local_450;
  if ((bool)((local_438 != 0 && 2 < local_474) & bVar9)) {
    iVar10 = Abc_FrameIsBridgeMode();
    pAVar28 = local_450;
    if (iVar10 != 0) {
      if (local_43c != 0) {
        Gia_GlaSendCancel((Gla_Man_t *)p_02,iVar34);
      }
      Gia_GlaSendAbsracted((Gla_Man_t *)p,iVar34);
      local_43c = 1;
    }
    if (*(int *)(*(long *)&p->nRegs + 0x54) != 0) {
      Abc_FrameSetStatus(-1);
      Abc_FrameSetCex((Abc_Cex_t *)0x0);
      Abc_FrameSetNFrames(uVar12);
      pcVar31 = *(char **)(*(long *)&p->nRegs + 0x68);
      if (pcVar31 == (char *)0x0) {
        pcVar31 = "glabs.aig";
      }
      pcVar31 = Extra_FileNameGenericAppend(pcVar31,".status");
      sprintf((char *)&local_418,"write_status %s",pcVar31);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,(char *)&local_418);
      Gia_GlaDumpAbsracted((Gla_Man_t *)p,pAVar28->fVerbose);
    }
  }
  lVar26 = local_458;
  iVar10 = Gia_GlaAbsCount((Gla_Man_t *)p,0,0);
  if (((100 - pAVar28->nRatioMin) * (p->nBufs + -1)) / 100 <= iVar10) {
    local_464 = -1;
    goto LAB_0056d181;
  }
  pAVar15 = *(Abs_Par_t **)&p->nRegs;
  uVar32 = (ulong)uVar12;
  local_474 = uVar12;
  local_438 = uVar24;
  if (pAVar15->nFramesMax <= (int)uVar12 && pAVar15->nFramesMax != 0) goto LAB_0056d181;
  goto LAB_0056c61e;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}